

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUISpriteBank::CGUISpriteBank(CGUISpriteBank *this,void **vtt,IGUIEnvironment *env)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 extraout_var;
  IVideoDriver *pIVar3;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IGUISpriteBank)._vptr_IGUISpriteBank = pp_Var1;
  *(void **)((long)&(this->super_IGUISpriteBank)._vptr_IGUISpriteBank + (long)pp_Var1[-3]) = vtt[2];
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IGUISpriteBank)._vptr_IGUISpriteBank = pp_Var1;
  *(void **)((long)&(this->super_IGUISpriteBank)._vptr_IGUISpriteBank + (long)pp_Var1[-3]) = vtt[3];
  *(undefined8 *)&(this->super_IGUISpriteBank).field_0x18 = 0;
  *(undefined8 *)&(this->super_IGUISpriteBank).field_0x8 = 0;
  *(undefined8 *)&(this->super_IGUISpriteBank).field_0x10 = 0;
  this->field_0x20 = 1;
  (this->Rectangles).m_data.
  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Rectangles).m_data.
  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Rectangles).m_data.
  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Rectangles).is_sorted = true;
  (this->Textures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Textures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Textures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Textures).is_sorted = true;
  this->Environment = env;
  this->Driver = (IVideoDriver *)0x0;
  if (env != (IGUIEnvironment *)0x0) {
    iVar2 = (*env->_vptr_IGUIEnvironment[6])(env);
    pIVar3 = (IVideoDriver *)CONCAT44(extraout_var,iVar2);
    this->Driver = pIVar3;
    if (pIVar3 != (IVideoDriver *)0x0) {
      *(int *)(&pIVar3->field_0x10 + (long)pIVar3->_vptr_IVideoDriver[-3]) =
           *(int *)(&pIVar3->field_0x10 + (long)pIVar3->_vptr_IVideoDriver[-3]) + 1;
    }
  }
  return;
}

Assistant:

CGUISpriteBank::CGUISpriteBank(IGUIEnvironment *env) :
		Environment(env), Driver(0)
{
#ifdef _DEBUG
	setDebugName("CGUISpriteBank");
#endif

	if (Environment) {
		Driver = Environment->getVideoDriver();
		if (Driver)
			Driver->grab();
	}
}